

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

void __thiscall kj::requireOnStack(kj *this,void *ptr,StringPtr description)

{
  bool _kjCondition;
  char stackVar;
  Fault f;
  StringPtr description_local;
  Array<char> local_20;
  
  description_local.content.size_ = (size_t)description.content.ptr;
  _kjCondition = this + (0xffff - (long)&stackVar) < (kj *)0x1ffff;
  if (_kjCondition) {
    return;
  }
  description_local.content.ptr = (char *)ptr;
  str<kj::StringPtr&>((String *)&local_20,(kj *)&description_local,
                      (StringPtr *)description_local.content.size_);
  _::Debug::Fault::Fault<kj::Exception::Type,bool&,kj::String>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
             ,0x4d5,FAILED,"offset < 65536 && offset > -65536","_kjCondition,kj::str(description)",
             &_kjCondition,(String *)&local_20);
  Array<char>::~Array(&local_20);
  _::Debug::Fault::fatal(&f);
}

Assistant:

void requireOnStack(void* ptr, kj::StringPtr description) {
#if defined(FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION) || \
    KJ_HAS_COMPILER_FEATURE(address_sanitizer) || \
    defined(__SANITIZE_ADDRESS__)
  // When using libfuzzer or ASAN, this sanity check may spurriously fail, so skip it.
#else
  char stackVar;
  ptrdiff_t offset = reinterpret_cast<char*>(ptr) - &stackVar;
  KJ_REQUIRE(offset < 65536 && offset > -65536,
            kj::str(description));
#endif
}